

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleGlyphsDrawingContext.cpp
# Opt level: O2

void __thiscall
SimpleGlyphsDrawingContext::Flush(SimpleGlyphsDrawingContext *this,bool inComputeAdvance)

{
  GlyphUnicodeMappingList *inText;
  PDFUsedFont *this_00;
  _List_node_base *p_Var1;
  double dVar2;
  UIntList glyphs;
  uint local_4c;
  _List_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  if ((this->mText).super__List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>.
      _M_impl._M_node._M_size == 0) {
    if (inComputeAdvance) {
      this->mLatestAdvance = 0.0;
    }
  }
  else {
    inText = &this->mText;
    AbstractContentContext::SetupColor(this->mContentContext,&this->mOptions);
    AbstractContentContext::BT(this->mContentContext);
    AbstractContentContext::Tm(this->mContentContext,1.0,0.0,0.0,1.0,this->mX,this->mY);
    AbstractContentContext::SetCurrentFontSize(this->mContentContext,(this->mOptions).fontSize);
    AbstractContentContext::Tj(this->mContentContext,inText);
    AbstractContentContext::ET(this->mContentContext);
    if (inComputeAdvance) {
      local_48._M_impl._M_node._M_size = 0;
      p_Var1 = (_List_node_base *)inText;
      local_48._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_48;
      local_48._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_48;
      while (p_Var1 = (((_List_base<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_> *)
                       &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var1 != (_List_node_base *)inText) {
        local_4c = (uint)*(ushort *)((long)(p_Var1 + 1 + 1) + 8);
        std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((list<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,&local_4c);
      }
      this_00 = AbstractContentContext::GetCurrentFont(this->mContentContext);
      dVar2 = PDFUsedFont::CalculateTextAdvance
                        (this_00,(UIntList *)&local_48,(this->mOptions).fontSize);
      this->mLatestAdvance = dVar2;
      std::__cxx11::_List_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_clear(&local_48);
    }
    std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::clear(inText);
  }
  return;
}

Assistant:

void SimpleGlyphsDrawingContext::Flush(bool inComputeAdvance) {
	// current font is expected to have been set in advance, so don't bother with it, and can
	// grab current font

	if(mText.size() == 0) {
		if(inComputeAdvance) {
			mLatestAdvance = 0;
		}
		return;
	}

    mContentContext->SetupColor(mOptions);
	mContentContext->BT();
	mContentContext->Tm(1,0,0,1,mX,mY);
	mContentContext->SetCurrentFontSize(mOptions.fontSize);
	mContentContext->Tj(mText);
	mContentContext->ET();	

	if(inComputeAdvance) {
		UIntList glyphs;

		GlyphUnicodeMappingList::iterator it = mText.begin();
		for(;it!=mText.end(); ++it) {
			glyphs.push_back(it->mGlyphCode);
		}
		
		mLatestAdvance = mContentContext->GetCurrentFont()->CalculateTextAdvance(glyphs, mOptions.fontSize);
	}

	mText.clear();
}